

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_buffer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  MapMethod MVar1;
  int iVar2;
  undefined8 in_RAX;
  GLFWwindow *handle;
  void *pvVar3;
  PFNGLMAPBUFFERRANGEEXTPROC *pp_Var4;
  char *pcVar5;
  long lVar6;
  PFNGLUNMAPBUFFEROESPROC *pp_Var7;
  size_t sStack_40;
  undefined8 local_38;
  
  local_38 = in_RAX;
  for (lVar6 = 1; lVar6 < argc; lVar6 = lVar6 + 1) {
    pcVar5 = argv[lVar6];
    iVar2 = strcmp(pcVar5,"map_buffer_oes");
    if (iVar2 == 0) {
      MVar1 = MAP_BUFFER_OES;
    }
    else {
      iVar2 = strcmp(pcVar5,"map_buffer_range_ext");
      MVar1 = MAP_BUFFER_RANGE_EXT;
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar5,"map_buffer_range_3_0");
        MVar1 = MAP_BUFFER_RANGE_3_0;
        if (iVar2 != 0) {
          fprintf(_stderr,"error: unexpected arg %s\n",pcVar5);
          iVar2 = 1;
          goto LAB_00108142;
        }
      }
    }
    mapMethod = MVar1;
  }
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2200b,0x36002);
  glfwWindowHint(0x22001,0x30002);
  glfwWindowHint(0x22002,2);
  handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    return 0x7d;
  }
  glfwMakeContextCurrent(handle);
  iVar2 = gladLoadGLES2Loader(glfwGetProcAddress);
  if (iVar2 == 0) {
    return 1;
  }
  if (mapMethod == MAP_BUFFER_RANGE_3_0) {
    if (GLAD_GL_ES_VERSION_3_0 == 0) {
      pcVar5 = "error: OpenGL ES 3.0 not supported\n";
      sStack_40 = 0x23;
LAB_00108185:
      fwrite(pcVar5,sStack_40,1,_stderr);
      iVar2 = 0x7d;
LAB_00108142:
      exit(iVar2);
    }
    (*glad_glGenBuffers)(2,(GLuint *)&local_38);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    (*glad_glBufferData)(0x8892,1000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBufferRange)(0x8892,100,200,2);
    memset(pvVar3,0,200);
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glBindBuffer)(0x8892,local_38._4_4_);
    (*glad_glBufferData)(0x8892,2000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBufferRange)(0x8892,200,300,0x12);
    memset(pvVar3,0,300);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    pvVar3 = (*glad_glMapBufferRange)(0x8892,100,200,0x12);
    memset(pvVar3,0,200);
    (*glad_glBindBuffer)(0x8892,local_38._4_4_);
    (*glad_glFlushMappedBufferRange)(0x8892,0x14,0x1e);
    (*glad_glFlushMappedBufferRange)(0x8892,0x28,0x32);
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    (*glad_glFlushMappedBufferRange)(0x8892,10,0x14);
    (*glad_glFlushMappedBufferRange)(0x8892,0x1e,0x28);
    (*glad_glUnmapBuffer)(0x8892);
    pp_Var4 = &glad_glMapBufferRange;
    pp_Var7 = &glad_glUnmapBuffer;
LAB_001080ee:
    (**pp_Var4)(0x8892,100,200,1);
    (**pp_Var7)(0x8892);
  }
  else {
    if (mapMethod == MAP_BUFFER_RANGE_EXT) {
      if (GLAD_GL_EXT_map_buffer_range == 0) {
        pcVar5 = "error: GL_EXT_map_buffer_range not supported\n";
        sStack_40 = 0x2d;
        goto LAB_00108185;
      }
      (*glad_glGenBuffers)(2,(GLuint *)&local_38);
      (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
      (*glad_glBufferData)(0x8892,1000,(void *)0x0,0x88e4);
      pvVar3 = (*glad_glMapBufferRangeEXT)(0x8892,100,200,2);
      memset(pvVar3,0,200);
      (*glad_glUnmapBufferOES)(0x8892);
      (*glad_glBindBuffer)(0x8892,local_38._4_4_);
      (*glad_glBufferData)(0x8892,2000,(void *)0x0,0x88e4);
      pvVar3 = (*glad_glMapBufferRangeEXT)(0x8892,200,300,0x12);
      memset(pvVar3,0,300);
      (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
      pvVar3 = (*glad_glMapBufferRangeEXT)(0x8892,100,200,0x12);
      memset(pvVar3,0,200);
      (*glad_glBindBuffer)(0x8892,local_38._4_4_);
      (*glad_glFlushMappedBufferRangeEXT)(0x8892,0x14,0x1e);
      (*glad_glFlushMappedBufferRangeEXT)(0x8892,0x28,0x32);
      pp_Var7 = &glad_glUnmapBufferOES;
      (*glad_glUnmapBufferOES)(0x8892);
      (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
      (*glad_glFlushMappedBufferRangeEXT)(0x8892,10,0x14);
      (*glad_glFlushMappedBufferRangeEXT)(0x8892,0x1e,0x28);
      (*glad_glUnmapBufferOES)(0x8892);
      pp_Var4 = &glad_glMapBufferRangeEXT;
      goto LAB_001080ee;
    }
    if (mapMethod != MAP_BUFFER_OES) goto LAB_00108107;
    if (GLAD_GL_OES_mapbuffer == 0) {
      pcVar5 = "error: GL_OES_mapbuffer not supported\n";
      sStack_40 = 0x26;
      goto LAB_00108185;
    }
    (*glad_glGenBuffers)(2,(GLuint *)&local_38);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    (*glad_glBufferData)(0x8892,1000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBufferOES)(0x8892,0x88b9);
    memset(pvVar3,1,1000);
    (*glad_glUnmapBufferOES)(0x8892);
    (*glad_glBindBuffer)(0x8892,local_38._4_4_);
    (*glad_glBufferData)(0x8892,2000,(void *)0x0,0x88e4);
    pvVar3 = (*glad_glMapBufferOES)(0x8892,0x88b9);
    memset(pvVar3,2,2000);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    pvVar3 = (*glad_glMapBufferOES)(0x8892,0x88b9);
    memset(pvVar3,3,1000);
    (*glad_glBindBuffer)(0x8892,local_38._4_4_);
    (*glad_glUnmapBufferOES)(0x8892);
    (*glad_glBindBuffer)(0x8892,(GLuint)local_38);
    (*glad_glUnmapBufferOES)(0x8892);
  }
  (*glad_glDeleteBuffers)(2,(GLuint *)&local_38);
LAB_00108107:
  glfwDestroyWindow(handle);
  glfwTerminate();
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    parseArgs(argc, argv);

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

   if (!gladLoadGLES2Loader((GLADloadproc) glfwGetProcAddress)) {
       return EXIT_FAILURE;
   }

    switch (mapMethod) {
    case MAP_BUFFER_OES:
        testMapBufferOES();
        break;
    case MAP_BUFFER_RANGE_EXT:
        testMapBufferRangeEXT();
        break;
    case MAP_BUFFER_RANGE_3_0:
        testMapBufferRange30();
        break;
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}